

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O0

void __thiscall
Saturation::SaturationAlgorithm::addInputClause(SaturationAlgorithm *this,Clause *cl)

{
  UnitInputType UVar1;
  bool bVar2;
  byte bVar3;
  Sos SVar4;
  uint uVar5;
  SaturationAlgorithm *in_RSI;
  SaturationAlgorithm *in_RDI;
  uint level;
  bool sosForTheory;
  bool sosForAxioms;
  Clause *in_stack_00000128;
  Instantiation *in_stack_00000130;
  undefined4 in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffdc;
  undefined1 in_stack_ffffffffffffffdd;
  undefined1 uVar6;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 uVar7;
  undefined1 in_stack_ffffffffffffffdf;
  undefined1 uVar8;
  uint in_stack_ffffffffffffffe8;
  undefined2 in_stack_ffffffffffffffec;
  byte bVar9;
  byte bVar10;
  
  if (in_RDI->_symEl != (SymElOutput *)0x0) {
    SymElOutput::onInputClause
              ((SymElOutput *)in_RDI,
               (Clause *)
               CONCAT17(in_stack_ffffffffffffffdf,
                        CONCAT16(in_stack_ffffffffffffffde,
                                 CONCAT15(in_stack_ffffffffffffffdd,
                                          CONCAT14(in_stack_ffffffffffffffdc,
                                                   in_stack_ffffffffffffffd8)))));
  }
  SVar4 = Shell::Options::sos(*(Options **)
                               &(((Unit *)&in_RDI->super_MainLoop)->_inference).field_0x8);
  uVar8 = true;
  if (SVar4 != ON) {
    SVar4 = Shell::Options::sos(*(Options **)
                                 &(((Unit *)&in_RDI->super_MainLoop)->_inference).field_0x8);
    uVar8 = SVar4 == ALL;
  }
  uVar7 = false;
  if ((bool)uVar8 != false) {
    UVar1 = Kernel::Unit::inputType((Unit *)0xad005c);
    uVar7 = UVar1 == AXIOM;
  }
  bVar10 = uVar7;
  SVar4 = Shell::Options::sos(*(Options **)
                               &(((Unit *)&in_RDI->super_MainLoop)->_inference).field_0x8);
  uVar6 = false;
  if (SVar4 == THEORY) {
    uVar5 = Shell::Options::sosTheoryLimit
                      (*(Options **)&(((Unit *)&in_RDI->super_MainLoop)->_inference).field_0x8);
    uVar6 = uVar5 == 0;
  }
  bVar9 = uVar6;
  bVar2 = Shell::Options::sineToAge
                    (*(Options **)&(((Unit *)&in_RDI->super_MainLoop)->_inference).field_0x8);
  if (bVar2) {
    bVar3 = Kernel::Unit::getSineLevel((Unit *)0xad00cc);
    in_stack_ffffffffffffffe8 = (uint)bVar3;
    if (in_stack_ffffffffffffffe8 == 0xffffffff) {
      in_stack_ffffffffffffffe8 = DAT_01333848 - 1;
    }
    Kernel::Clause::setAge
              ((Clause *)in_RDI,
               CONCAT13(uVar8,CONCAT12(uVar7,CONCAT11(uVar6,in_stack_ffffffffffffffdc))));
  }
  if (((bVar10 & 1) != 0) ||
     ((bVar2 = Kernel::Unit::isPureTheoryDescendant((Unit *)0xad010b), bVar2 && ((bVar9 & 1) != 0)))
     ) {
    addInputSOSClause(in_RSI,(Clause *)
                             CONCAT17(bVar10,CONCAT16(bVar9,CONCAT24(in_stack_ffffffffffffffec,
                                                                     in_stack_ffffffffffffffe8))));
  }
  else {
    addNewClause(in_RDI,(Clause *)
                        CONCAT17(uVar8,CONCAT16(uVar7,CONCAT15(uVar6,CONCAT14(
                                                  in_stack_ffffffffffffffdc,
                                                  in_stack_ffffffffffffffd8)))));
  }
  if (in_RDI->_instantiation != (Instantiation *)0x0) {
    Inferences::Instantiation::registerClause(in_stack_00000130,in_stack_00000128);
  }
  *(int *)(DAT_01333840 + 0x10) = *(int *)(DAT_01333840 + 0x10) + 1;
  return;
}

Assistant:

void SaturationAlgorithm::addInputClause(Clause* cl)
{
  ASS_LE(toNumber(cl->inputType()),toNumber(UnitInputType::CLAIM)); // larger input types should not appear in proof search

  if (_symEl) {
    _symEl->onInputClause(cl);
  }

  bool sosForAxioms = _opt.sos() == Options::Sos::ON || _opt.sos() == Options::Sos::ALL;
  sosForAxioms = sosForAxioms && cl->inputType() == UnitInputType::AXIOM;

  bool sosForTheory = _opt.sos() == Options::Sos::THEORY && _opt.sosTheoryLimit() == 0;

  if (_opt.sineToAge()) {
    unsigned level = cl->getSineLevel();
    // cout << "Adding " << cl->toString() << " level " << level;
    if (level == UINT_MAX) {
      level = env.maxSineLevel - 1; // as the next available (unused) value
      // cout << " -> " << level;
    }
    // cout << endl;
    cl->setAge(level);
  }

  if (sosForAxioms || (cl->isPureTheoryDescendant() && sosForTheory)) {
    addInputSOSClause(cl);
  }
  else {
    addNewClause(cl);
  }

  if (_instantiation) {
    _instantiation->registerClause(cl);
  }

  env.statistics->initialClauses++;
}